

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_align_test.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::anon_unknown_0::ArenaAlign_CeilDefaultAligned_Test::
~ArenaAlign_CeilDefaultAligned_Test(ArenaAlign_CeilDefaultAligned_Test *this)

{
  ArenaAlign_CeilDefaultAligned_Test *this_local;
  
  ~ArenaAlign_CeilDefaultAligned_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ArenaAlign, CeilDefaultAligned) {
  alignas(128) char p[129] = {0};
  auto align_64 = ArenaAlignAs(64);
  EXPECT_THAT(align_64.CeilDefaultAligned(p + 0), Eq(p));
  EXPECT_THAT(align_64.CeilDefaultAligned(p + 8), Eq(p + 64));
  EXPECT_THAT(align_64.CeilDefaultAligned(p + 56), Eq(p + 64));
  EXPECT_THAT(align_64.CeilDefaultAligned(p + 64), Eq(p + 64));
  EXPECT_THAT(align_64.CeilDefaultAligned(p + 72), Eq(p + 128));
  EXPECT_THAT(align_64.CeilDefaultAligned(p + 120), Eq(p + 128));
  EXPECT_THAT(align_64.CeilDefaultAligned(p + 128), Eq(p + 128));
#if GTEST_HAS_DEATH_TEST
  EXPECT_DEBUG_DEATH(align_64.CeilDefaultAligned(p + 1), ".*");
  EXPECT_DEBUG_DEATH(align_64.CeilDefaultAligned(p + 7), ".*");
  EXPECT_DEBUG_DEATH(align_64.CeilDefaultAligned(p + 63), ".*");
  EXPECT_DEBUG_DEATH(align_64.CeilDefaultAligned(p + 65), ".*");
  EXPECT_DEBUG_DEATH(align_64.CeilDefaultAligned(p + 127), ".*");
  EXPECT_DEBUG_DEATH(align_64.CeilDefaultAligned(p + 129), ".*");
#endif  // GTEST_HAS_DEATH_TEST
}